

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void __thiscall QPDF::initializeEncryption(QPDF *this)

{
  mapped_type mVar1;
  int iVar2;
  int V_00;
  bool bVar3;
  __type_conflict1 _Var4;
  int iVar5;
  encryption_method_e eVar6;
  int iVar7;
  pointer pMVar8;
  element_type *peVar9;
  QPDFExc *pQVar10;
  undefined4 extraout_var;
  longlong lVar11;
  element_type *peVar12;
  undefined4 extraout_var_00;
  qpdf_offset_t qVar13;
  long lVar14;
  mapped_type *pmVar15;
  element_type *peVar16;
  undefined4 extraout_var_01;
  EncryptionData *data_00;
  bool local_11e5;
  bool local_115a;
  bool local_106a;
  bool local_ffa;
  bool local_faa;
  allocator<char> local_f71;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  QPDFExc local_f28;
  string local_ea8;
  bool local_e81;
  undefined1 local_e80 [7];
  bool perms_valid;
  string local_e60;
  undefined1 local_e3a;
  allocator<char> local_e39;
  string local_e38;
  allocator<char> local_e11;
  string local_e10;
  string local_df0;
  undefined1 local_dd0 [8];
  EncryptionData data;
  shared_ptr<QPDF::EncryptionParameters> local_ce8;
  QPDFObjectHandle local_cd8;
  shared_ptr<QPDF::EncryptionParameters> local_cc8;
  QPDFObjectHandle local_cb8;
  shared_ptr<QPDF::EncryptionParameters> local_ca8;
  allocator<char> local_c91;
  string local_c90 [32];
  undefined1 local_c70 [8];
  QPDFObjectHandle EFF;
  string local_c58 [32];
  undefined1 local_c38 [8];
  QPDFObjectHandle StrF;
  string local_c20 [32];
  undefined1 local_c00 [8];
  QPDFObjectHandle StmF;
  string local_be8 [32];
  QPDFObjectHandle local_bc8;
  undefined1 local_bb8 [8];
  string method_name;
  string local_b90 [32];
  QPDFObjectHandle local_b70;
  mapped_type local_b5c;
  undefined1 local_b58 [4];
  encryption_method_e method;
  QPDFObjectHandle cdict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filter;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_af0 [32];
  undefined1 local_ad0 [8];
  QPDFObjectHandle CF;
  string local_ab8 [32];
  QPDFObjectHandle local_a98;
  byte local_a84;
  byte local_a83;
  byte local_a82;
  allocator<char> local_a81;
  string local_a80 [32];
  QPDFObjectHandle local_a60;
  allocator<char> local_a49;
  string local_a48 [32];
  QPDFObjectHandle local_a28;
  allocator<char> local_a11;
  string local_a10 [32];
  QPDFObjectHandle local_9f0;
  int local_9e0;
  allocator<char> local_9d9;
  int Length;
  QPDFObjectHandle local_9b8;
  string local_9a8;
  allocator<char> local_981;
  string local_980 [32];
  QPDFObjectHandle local_960;
  string local_950;
  allocator<char> local_929;
  string local_928 [32];
  QPDFObjectHandle local_908;
  string local_8f8;
  undefined1 local_8d2;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  byte local_884;
  byte local_883;
  byte local_882;
  allocator<char> local_881;
  string local_880 [32];
  QPDFObjectHandle local_860;
  byte local_84c;
  byte local_84b;
  byte local_84a;
  allocator<char> local_849;
  string local_848 [32];
  QPDFObjectHandle local_828;
  allocator<char> local_811;
  string local_810 [32];
  QPDFObjectHandle local_7f0;
  undefined1 local_7da;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  undefined1 local_790 [8];
  string Perms;
  string UE;
  string OE;
  string local_728;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638 [32];
  QPDFObjectHandle local_618;
  int local_608;
  allocator<char> local_601;
  int P;
  QPDFObjectHandle local_5e0;
  undefined1 local_5d0 [8];
  string U;
  string local_5a8 [32];
  QPDFObjectHandle local_588;
  undefined1 local_578 [8];
  string O;
  string local_550 [32];
  QPDFObjectHandle local_530;
  int local_520;
  allocator<char> local_519;
  int R;
  QPDFObjectHandle local_4f8;
  int local_4e8;
  undefined1 local_4e2;
  allocator<char> local_4e1;
  int V;
  allocator<char> local_4b9;
  string local_4b8;
  byte local_494;
  byte local_493;
  byte local_492;
  allocator<char> local_491;
  string local_490 [32];
  QPDFObjectHandle local_470;
  byte local_45c;
  byte local_45b;
  byte local_45a;
  allocator<char> local_459;
  string local_458 [32];
  QPDFObjectHandle local_438;
  byte local_424;
  byte local_423;
  byte local_422;
  allocator<char> local_421;
  string local_420 [32];
  QPDFObjectHandle local_400;
  byte local_3ec;
  byte local_3eb;
  byte local_3ea;
  allocator<char> local_3e9;
  string local_3e8 [32];
  QPDFObjectHandle local_3c8;
  allocator<char> local_3b1;
  string local_3b0 [32];
  QPDFObjectHandle local_390;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328 [32];
  QPDFObjectHandle local_308;
  undefined1 local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  byte local_2a5;
  byte local_2a4;
  byte local_2a3;
  byte local_2a2;
  allocator<char> local_2a1;
  string local_2a0 [32];
  QPDFObjectHandle local_280;
  string local_270;
  allocator<char> local_249;
  string local_248 [32];
  QPDFObjectHandle local_228;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  QPDFObjectHandle encryption_dict;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  QPDFExc local_168;
  QPDFObjectHandle local_e8;
  string local_d8;
  byte local_b1;
  QPDFObjectHandle local_b0;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  QPDFObjectHandle id_obj;
  string id1;
  allocator<char> local_31;
  string local_30;
  QPDF *local_10;
  QPDF *this_local;
  
  local_10 = this;
  pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar9 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar8->encp);
  if ((peVar9->encryption_initialized & 1U) == 0) {
    pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar9 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar8->encp);
    peVar9->encryption_initialized = true;
    pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Encrypt",&local_31);
    bVar3 = QPDFObjectHandle::hasKey(&pMVar8->trailer,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar9 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar8->encp);
      peVar9->encrypted = true;
      std::__cxx11::string::string
                ((string *)
                 &id_obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_98,"/ID",&local_99);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)&pMVar8->trailer);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
      local_b1 = 0;
      bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_78);
      local_faa = false;
      if (bVar3) {
        iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_78);
        local_faa = false;
        if (iVar5 == 2) {
          QPDFObjectHandle::getArrayItem(&local_b0,(int)local_78);
          local_b1 = 1;
          local_faa = QPDFObjectHandle::isString(&local_b0);
        }
      }
      if ((local_b1 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
      }
      if (local_faa == false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"trailer",&local_189);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"invalid /ID in trailer dictionary",
                   (allocator<char> *)
                   ((long)&encryption_dict.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        damagedPDF(&local_168,this,&local_188,&local_1b0);
        warn(this,&local_168);
        QPDFExc::~QPDFExc(&local_168);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&encryption_dict.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
      }
      else {
        QPDFObjectHandle::getArrayItem(&local_e8,(int)local_78);
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_d8,&local_e8);
        std::__cxx11::string::operator=
                  ((string *)
                   &id_obj.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
      }
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1e8,"/Encrypt",&local_1e9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1c8,(string *)&pMVar8->trailer);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1c8);
      if (!bVar3) {
        local_212 = 1;
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"/Encrypt in trailer dictionary is not a dictionary",
                   &local_211);
        damagedPDF(pQVar10,this,&local_210);
        local_212 = 0;
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      std::allocator<char>::allocator();
      local_2a2 = 0;
      local_2a3 = 0;
      local_2a4 = 0;
      local_2a5 = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_248,"/Filter",&local_249);
      QPDFObjectHandle::getKey(&local_228,(string *)local_1c8);
      bVar3 = QPDFObjectHandle::isName(&local_228);
      local_ffa = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_2a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_2a0,"/Filter",&local_2a1);
        local_2a3 = 1;
        QPDFObjectHandle::getKey(&local_280,(string *)local_1c8);
        local_2a4 = 1;
        QPDFObjectHandle::getName_abi_cxx11_(&local_270,&local_280);
        local_2a5 = 1;
        local_ffa = std::operator==(&local_270,"/Standard");
      }
      if ((local_2a5 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_270);
      }
      if ((local_2a4 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_280);
      }
      if ((local_2a3 & 1) != 0) {
        std::__cxx11::string::~string(local_2a0);
      }
      if ((local_2a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_2a1);
      }
      QPDFObjectHandle::~QPDFObjectHandle(&local_228);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
      if (((local_ffa ^ 0xffU) & 1) != 0) {
        local_2f2 = 1;
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar12 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pMVar8->file);
        iVar5 = (*peVar12->_vptr_InputSource[3])();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,"encryption dictionary",&local_2c9);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar12 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pMVar8->file);
        qVar13 = InputSource::getLastOffset(peVar12);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"unsupported encryption filter",&local_2f1);
        QPDFExc::QPDFExc(pQVar10,qpdf_e_unsupported,(string *)CONCAT44(extraout_var,iVar5),
                         &local_2c8,qVar13,&local_2f0);
        local_2f2 = 0;
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_328,"/SubFilter",&local_329);
      QPDFObjectHandle::getKey(&local_308,(string *)local_1c8);
      bVar3 = QPDFObjectHandle::isNull(&local_308);
      QPDFObjectHandle::~QPDFObjectHandle(&local_308);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator(&local_329);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"encryption dictionary",&local_351);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar12 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pMVar8->file);
        qVar13 = InputSource::getLastOffset(peVar12);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,
                   "file uses encryption SubFilters, which qpdf does not support",&local_379);
        warn(this,qpdf_e_unsupported,&local_350,qVar13,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
      }
      std::allocator<char>::allocator();
      local_3ea = 0;
      local_3eb = 0;
      local_3ec = 0;
      local_422 = 0;
      local_423 = 0;
      local_424 = 0;
      local_45a = 0;
      local_45b = 0;
      local_45c = 0;
      local_492 = 0;
      local_493 = 0;
      local_494 = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_3b0,"/V",&local_3b1);
      QPDFObjectHandle::getKey(&local_390,(string *)local_1c8);
      bVar3 = QPDFObjectHandle::isInteger(&local_390);
      local_106a = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_3ea = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_3e8,"/R",&local_3e9);
        local_3eb = 1;
        QPDFObjectHandle::getKey(&local_3c8,(string *)local_1c8);
        local_3ec = 1;
        bVar3 = QPDFObjectHandle::isInteger(&local_3c8);
        local_106a = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_422 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_420,"/O",&local_421);
          local_423 = 1;
          QPDFObjectHandle::getKey(&local_400,(string *)local_1c8);
          local_424 = 1;
          bVar3 = QPDFObjectHandle::isString(&local_400);
          local_106a = false;
          if (bVar3) {
            std::allocator<char>::allocator();
            local_45a = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_458,"/U",&local_459);
            local_45b = 1;
            QPDFObjectHandle::getKey(&local_438,(string *)local_1c8);
            local_45c = 1;
            bVar3 = QPDFObjectHandle::isString(&local_438);
            local_106a = false;
            if (bVar3) {
              std::allocator<char>::allocator();
              local_492 = 1;
              std::__cxx11::string::string<std::allocator<char>>(local_490,"/P",&local_491);
              local_493 = 1;
              QPDFObjectHandle::getKey(&local_470,(string *)local_1c8);
              local_494 = 1;
              local_106a = QPDFObjectHandle::isInteger(&local_470);
            }
          }
        }
      }
      if ((local_494 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_470);
      }
      if ((local_493 & 1) != 0) {
        std::__cxx11::string::~string(local_490);
      }
      if ((local_492 & 1) != 0) {
        std::allocator<char>::~allocator(&local_491);
      }
      if ((local_45c & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_438);
      }
      if ((local_45b & 1) != 0) {
        std::__cxx11::string::~string(local_458);
      }
      if ((local_45a & 1) != 0) {
        std::allocator<char>::~allocator(&local_459);
      }
      if ((local_424 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_400);
      }
      if ((local_423 & 1) != 0) {
        std::__cxx11::string::~string(local_420);
      }
      if ((local_422 & 1) != 0) {
        std::allocator<char>::~allocator(&local_421);
      }
      if ((local_3ec & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_3c8);
      }
      if ((local_3eb & 1) != 0) {
        std::__cxx11::string::~string(local_3e8);
      }
      if ((local_3ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_3e9);
      }
      QPDFObjectHandle::~QPDFObjectHandle(&local_390);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      if (((local_106a ^ 0xffU) & 1) != 0) {
        local_4e2 = 1;
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b8,"encryption dictionary",&local_4b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&V,
                   "some encryption dictionary parameters are missing or the wrong type",&local_4e1)
        ;
        damagedPDF(pQVar10,this,&local_4b8,(string *)&V);
        local_4e2 = 0;
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&R,"/V",&local_519);
      QPDFObjectHandle::getKey(&local_4f8,(string *)local_1c8);
      iVar5 = QPDFObjectHandle::getIntValueAsInt(&local_4f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_4f8);
      std::__cxx11::string::~string((string *)&R);
      std::allocator<char>::~allocator(&local_519);
      local_4e8 = iVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_550,"/R",(allocator<char> *)(O.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::getKey(&local_530,(string *)local_1c8);
      iVar5 = QPDFObjectHandle::getIntValueAsInt(&local_530);
      QPDFObjectHandle::~QPDFObjectHandle(&local_530);
      std::__cxx11::string::~string(local_550);
      std::allocator<char>::~allocator((allocator<char> *)(O.field_2._M_local_buf + 0xf));
      local_520 = iVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_5a8,"/O",(allocator<char> *)(U.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::getKey(&local_588,(string *)local_1c8);
      QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_578,&local_588);
      QPDFObjectHandle::~QPDFObjectHandle(&local_588);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)(U.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&P,"/U",&local_601);
      QPDFObjectHandle::getKey(&local_5e0,(string *)local_1c8);
      QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_5d0,&local_5e0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_5e0);
      std::__cxx11::string::~string((string *)&P);
      std::allocator<char>::~allocator(&local_601);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_638,"/P",&local_639);
      QPDFObjectHandle::getKey(&local_618,(string *)local_1c8);
      lVar11 = QPDFObjectHandle::getIntValue(&local_618);
      QPDFObjectHandle::~QPDFObjectHandle(&local_618);
      std::__cxx11::string::~string(local_638);
      std::allocator<char>::~allocator(&local_639);
      iVar5 = local_4e8;
      local_608 = (int)lVar11;
      if (((local_520 < 2) || (6 < local_520)) ||
         ((local_4e8 != 1 && (((local_4e8 != 2 && (local_4e8 != 4)) && (local_4e8 != 5)))))) {
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar12 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pMVar8->file);
        iVar5 = (*peVar12->_vptr_InputSource[3])();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_660,"encryption dictionary",&local_661);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar12 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pMVar8->file);
        qVar13 = InputSource::getLastOffset(peVar12);
        std::__cxx11::to_string(&local_708,local_520);
        std::operator+(&local_6e8,"Unsupported /R or /V in encryption dictionary; R = ",&local_708);
        std::operator+(&local_6c8,&local_6e8," (max 6), V = ");
        std::__cxx11::to_string(&local_728,local_4e8);
        std::operator+(&local_6a8,&local_6c8,&local_728);
        std::operator+(&local_688,&local_6a8," (max 5)");
        QPDFExc::QPDFExc(pQVar10,qpdf_e_unsupported,(string *)CONCAT44(extraout_var_00,iVar5),
                         &local_660,qVar13,&local_688);
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar9 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar8->encp);
      iVar2 = local_520;
      peVar9->encryption_V = iVar5;
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar9 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar8->encp);
      peVar9->encryption_R = iVar2;
      std::__cxx11::string::string((string *)(UE.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(Perms.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_790);
      if (local_4e8 < 5) {
        pad_short_parameter((string *)local_578,0x20);
        pad_short_parameter((string *)local_5d0,0x20);
        lVar14 = std::__cxx11::string::length();
        if ((lVar14 != 0x20) || (lVar14 = std::__cxx11::string::length(), lVar14 != 0x20)) {
          local_7da = 1;
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7b0,"encryption dictionary",&local_7b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7d8,
                     "incorrect length for /O and/or /U in encryption dictionary",&local_7d9);
          damagedPDF(pQVar10,this,&local_7b0,&local_7d8);
          local_7da = 0;
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
      }
      else {
        std::allocator<char>::allocator();
        local_84a = 0;
        local_84b = 0;
        local_84c = 0;
        local_882 = 0;
        local_883 = 0;
        local_884 = 0;
        std::__cxx11::string::string<std::allocator<char>>(local_810,"/OE",&local_811);
        QPDFObjectHandle::getKey(&local_7f0,(string *)local_1c8);
        bVar3 = QPDFObjectHandle::isString(&local_7f0);
        local_115a = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_84a = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_848,"/UE",&local_849);
          local_84b = 1;
          QPDFObjectHandle::getKey(&local_828,(string *)local_1c8);
          local_84c = 1;
          bVar3 = QPDFObjectHandle::isString(&local_828);
          local_115a = false;
          if (bVar3) {
            std::allocator<char>::allocator();
            local_882 = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_880,"/Perms",&local_881);
            local_883 = 1;
            QPDFObjectHandle::getKey(&local_860,(string *)local_1c8);
            local_884 = 1;
            local_115a = QPDFObjectHandle::isString(&local_860);
          }
        }
        if ((local_884 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_860);
        }
        if ((local_883 & 1) != 0) {
          std::__cxx11::string::~string(local_880);
        }
        if ((local_882 & 1) != 0) {
          std::allocator<char>::~allocator(&local_881);
        }
        if ((local_84c & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_828);
        }
        if ((local_84b & 1) != 0) {
          std::__cxx11::string::~string(local_848);
        }
        if ((local_84a & 1) != 0) {
          std::allocator<char>::~allocator(&local_849);
        }
        QPDFObjectHandle::~QPDFObjectHandle(&local_7f0);
        std::__cxx11::string::~string(local_810);
        std::allocator<char>::~allocator(&local_811);
        if (((local_115a ^ 0xffU) & 1) != 0) {
          local_8d2 = 1;
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a8,"encryption dictionary",&local_8a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8d0,
                     "some V=5 encryption dictionary parameters are missing or the wrong type",
                     &local_8d1);
          damagedPDF(pQVar10,this,&local_8a8,&local_8d0);
          local_8d2 = 0;
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_928,"/OE",&local_929);
        QPDFObjectHandle::getKey(&local_908,(string *)local_1c8);
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_8f8,&local_908);
        std::__cxx11::string::operator=
                  ((string *)(UE.field_2._M_local_buf + 8),(string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_908);
        std::__cxx11::string::~string(local_928);
        std::allocator<char>::~allocator(&local_929);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_980,"/UE",&local_981);
        QPDFObjectHandle::getKey(&local_960,(string *)local_1c8);
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_950,&local_960);
        std::__cxx11::string::operator=
                  ((string *)(Perms.field_2._M_local_buf + 8),(string *)&local_950);
        std::__cxx11::string::~string((string *)&local_950);
        QPDFObjectHandle::~QPDFObjectHandle(&local_960);
        std::__cxx11::string::~string(local_980);
        std::allocator<char>::~allocator(&local_981);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&Length,"/Perms",&local_9d9);
        QPDFObjectHandle::getKey(&local_9b8,(string *)local_1c8);
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_9a8,&local_9b8);
        std::__cxx11::string::operator=((string *)local_790,(string *)&local_9a8);
        std::__cxx11::string::~string((string *)&local_9a8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_9b8);
        std::__cxx11::string::~string((string *)&Length);
        std::allocator<char>::~allocator(&local_9d9);
        pad_short_parameter((string *)local_578,0x30);
        pad_short_parameter((string *)local_5d0,0x30);
        pad_short_parameter((string *)((long)&UE.field_2 + 8),0x20);
        pad_short_parameter((string *)((long)&Perms.field_2 + 8),0x20);
        pad_short_parameter((string *)local_790,0x10);
      }
      local_9e0 = 0;
      if (local_4e8 < 2) {
        local_9e0 = 0x28;
      }
      else if (local_4e8 == 4) {
        local_9e0 = 0x80;
      }
      else if (local_4e8 == 5) {
        local_9e0 = 0x100;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a10,"/Length",&local_a11);
        QPDFObjectHandle::getKey(&local_9f0,(string *)local_1c8);
        bVar3 = QPDFObjectHandle::isInteger(&local_9f0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_9f0);
        std::__cxx11::string::~string(local_a10);
        std::allocator<char>::~allocator(&local_a11);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_a48,"/Length",&local_a49);
          QPDFObjectHandle::getKey(&local_a28,(string *)local_1c8);
          local_9e0 = QPDFObjectHandle::getIntValueAsInt(&local_a28);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a28);
          std::__cxx11::string::~string(local_a48);
          std::allocator<char>::~allocator(&local_a49);
          if (((local_9e0 % 8 != 0) || (local_9e0 < 0x28)) || (0x80 < local_9e0)) {
            local_9e0 = 0;
          }
        }
      }
      if (local_9e0 == 0) {
        local_9e0 = 0x80;
      }
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar9 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar8->encp);
      peVar9->encrypt_metadata = true;
      local_a82 = 0;
      local_a83 = 0;
      local_a84 = 0;
      local_11e5 = false;
      if (3 < local_4e8) {
        std::allocator<char>::allocator();
        local_a82 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_a80,"/EncryptMetadata",&local_a81);
        local_a83 = 1;
        QPDFObjectHandle::getKey(&local_a60,(string *)local_1c8);
        local_a84 = 1;
        local_11e5 = QPDFObjectHandle::isBool(&local_a60);
      }
      if ((local_a84 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_a60);
      }
      if ((local_a83 & 1) != 0) {
        std::__cxx11::string::~string(local_a80);
      }
      if ((local_a82 & 1) != 0) {
        std::allocator<char>::~allocator(&local_a81);
      }
      if (local_11e5 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_ab8,"/EncryptMetadata",
                   (allocator<char> *)
                   ((long)&CF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::getKey(&local_a98,(string *)local_1c8);
        bVar3 = QPDFObjectHandle::getBoolValue(&local_a98);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        peVar9->encrypt_metadata = bVar3;
        QPDFObjectHandle::~QPDFObjectHandle(&local_a98);
        std::__cxx11::string::~string(local_ab8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&CF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
      }
      if ((local_4e8 == 4) || (local_4e8 == 5)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_af0,"/CF",(allocator<char> *)((long)&__range2 + 7));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_ad0,(string *)local_1c8);
        std::__cxx11::string::~string(local_af0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
        QPDFObjectHandle::getKeys_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2,(QPDFObjectHandle *)local_ad0);
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin2);
        filter = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin2);
        while (bVar3 = std::operator!=(&__end2,(_Self *)&filter), bVar3) {
          cdict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b58,(string *)local_ad0);
          bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_b58);
          if (bVar3) {
            local_b5c = e_none;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_b90,"/CFM",(allocator<char> *)(method_name.field_2._M_local_buf + 0xf))
            ;
            QPDFObjectHandle::getKey(&local_b70,(string *)local_b58);
            bVar3 = QPDFObjectHandle::isName(&local_b70);
            QPDFObjectHandle::~QPDFObjectHandle(&local_b70);
            std::__cxx11::string::~string(local_b90);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(method_name.field_2._M_local_buf + 0xf));
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_be8,"/CFM",
                         (allocator<char> *)
                         ((long)&StmF.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              QPDFObjectHandle::getKey(&local_bc8,(string *)local_b58);
              QPDFObjectHandle::getName_abi_cxx11_((string *)local_bb8,&local_bc8);
              QPDFObjectHandle::~QPDFObjectHandle(&local_bc8);
              std::__cxx11::string::~string(local_be8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&StmF.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_bb8,"/V2");
              if (bVar3) {
                QTC::TC("qpdf","QPDF_encryption CFM V2",0);
                local_b5c = e_rc4;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_bb8,"/AESV2");
                if (bVar3) {
                  QTC::TC("qpdf","QPDF_encryption CFM AESV2",0);
                  local_b5c = e_aes;
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_bb8,"/AESV3");
                  if (bVar3) {
                    QTC::TC("qpdf","QPDF_encryption CFM AESV3",0);
                    local_b5c = e_aesv3;
                  }
                  else {
                    local_b5c = e_unknown;
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_bb8);
            }
            mVar1 = local_b5c;
            pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar9 = std::
                     __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&pMVar8->encp);
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
                      ::operator[](&peVar9->crypt_filters,
                                   (key_type *)
                                   cdict.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
            *pmVar15 = mVar1;
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b58);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c20,"/StmF",
                   (allocator<char> *)
                   ((long)&StrF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_c00,(string *)local_1c8);
        std::__cxx11::string::~string(local_c20);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&StrF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c58,"/StrF",
                   (allocator<char> *)
                   ((long)&EFF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_c38,(string *)local_1c8);
        std::__cxx11::string::~string(local_c58);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&EFF.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_c90,"/EFF",&local_c91);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_c70,(string *)local_1c8);
        std::__cxx11::string::~string(local_c90);
        std::allocator<char>::~allocator(&local_c91);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_ca8,&pMVar8->encp);
        QPDFObjectHandle::QPDFObjectHandle(&local_cb8,(QPDFObjectHandle *)local_c00);
        eVar6 = interpretCF(&local_ca8,&local_cb8);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        peVar9->cf_stream = eVar6;
        QPDFObjectHandle::~QPDFObjectHandle(&local_cb8);
        std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_ca8);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_cc8,&pMVar8->encp);
        QPDFObjectHandle::QPDFObjectHandle(&local_cd8,(QPDFObjectHandle *)local_c38);
        eVar6 = interpretCF(&local_cc8,&local_cd8);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        peVar9->cf_string = eVar6;
        QPDFObjectHandle::~QPDFObjectHandle(&local_cd8);
        std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_cc8);
        bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_c70);
        if (bVar3) {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_ce8,&pMVar8->encp);
          QPDFObjectHandle::QPDFObjectHandle
                    ((QPDFObjectHandle *)&data.encrypt_metadata,(QPDFObjectHandle *)local_c70);
          eVar6 = interpretCF(&local_ce8,(QPDFObjectHandle *)&data.encrypt_metadata);
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          peVar9->cf_file = eVar6;
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&data.encrypt_metadata);
          std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_ce8);
        }
        else {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          eVar6 = peVar9->cf_stream;
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          peVar9->cf_file = eVar6;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c70);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c38);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c00);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_ad0);
      }
      V_00 = local_4e8;
      iVar2 = local_520;
      iVar5 = local_608;
      iVar7 = local_9e0;
      if (local_9e0 < 0) {
        iVar7 = local_9e0 + 7;
      }
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar9 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar8->encp);
      data_00 = (EncryptionData *)(ulong)(uint)(iVar7 >> 3);
      EncryptionData::EncryptionData
                ((EncryptionData *)local_dd0,V_00,iVar2,iVar7 >> 3,iVar5,(string *)local_578,
                 (string *)local_5d0,(string *)((long)&UE.field_2 + 8),
                 (string *)((long)&Perms.field_2 + 8),(string *)local_790,
                 (string *)
                 &id_obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (bool)(peVar9->encrypt_metadata & 1));
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      if ((pMVar8->provided_password_is_hex_key & 1U) == 0) {
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar16 = std::
                  __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&pMVar8->encp);
        bVar3 = check_owner_password
                          (&peVar9->user_password,&peVar16->provided_password,
                           (EncryptionData *)local_dd0);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        data_00 = (EncryptionData *)CONCAT71((int7)((ulong)data_00 >> 8),bVar3);
        peVar9->owner_password_matched = bVar3;
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        if (((peVar9->owner_password_matched & 1U) == 0) || (4 < local_4e8)) {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          bVar3 = check_user_password(&peVar9->provided_password,(EncryptionData *)local_dd0);
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          data_00 = (EncryptionData *)CONCAT71((int7)((ulong)data_00 >> 8),bVar3);
          peVar9->user_password_matched = bVar3;
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          if ((peVar9->user_password_matched & 1U) != 0) {
            pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar9 = std::
                     __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&pMVar8->encp);
            pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar16 = std::
                      __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&pMVar8->encp);
            std::__cxx11::string::operator=
                      ((string *)&peVar16->user_password,(string *)&peVar9->provided_password);
          }
        }
        else {
          getTrimmedUserPassword_abi_cxx11_(&local_df0,this);
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          _Var4 = std::operator==(&local_df0,&peVar9->provided_password);
          std::__cxx11::string::~string((string *)&local_df0);
          if (_Var4) {
            pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar9 = std::
                     __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&pMVar8->encp);
            peVar9->user_password_matched = true;
            QTC::TC("qpdf","QPDF_encryption user matches owner V < 5",0);
          }
        }
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        if ((peVar9->user_password_matched & 1U) != 0) {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          if ((peVar9->owner_password_matched & 1U) != 0) {
            QTC::TC("qpdf","QPDF_encryption same password",(uint)(4 < local_4e8));
          }
        }
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        if ((peVar9->owner_password_matched & 1U) == 0) {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          if ((peVar9->user_password_matched & 1U) == 0) {
            local_e3a = 1;
            pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
            pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar12 = std::
                      __shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&pMVar8->file);
            iVar5 = (*peVar12->_vptr_InputSource[3])();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_e10,"",&local_e11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e38,"invalid password",&local_e39);
            QPDFExc::QPDFExc(pQVar10,qpdf_e_password,(string *)CONCAT44(extraout_var_01,iVar5),
                             &local_e10,0,&local_e38);
            local_e3a = 0;
            __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
        }
      }
      pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      if ((pMVar8->provided_password_is_hex_key & 1U) == 0) {
        if (local_4e8 < 5) {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          compute_encryption_key
                    ((string *)local_e80,(QPDF *)&peVar9->user_password,(string *)local_dd0,data_00)
          ;
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          std::__cxx11::string::operator=((string *)&peVar9->encryption_key,(string *)local_e80);
          std::__cxx11::string::~string((string *)local_e80);
        }
        else {
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          recover_encryption_key_with_password
                    (&local_ea8,&peVar9->provided_password,(EncryptionData *)local_dd0,&local_e81);
          pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar9 = std::
                   __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pMVar8->encp);
          std::__cxx11::string::operator=((string *)&peVar9->encryption_key,(string *)&local_ea8);
          std::__cxx11::string::~string((string *)&local_ea8);
          if ((local_e81 & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f48,"encryption dictionary",&local_f49);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f70,
                       "/Perms field in encryption dictionary doesn\'t match expected value",
                       &local_f71);
            damagedPDF(&local_f28,this,&local_f48,&local_f70);
            warn(this,&local_f28);
            QPDFExc::~QPDFExc(&local_f28);
            std::__cxx11::string::~string((string *)&local_f70);
            std::allocator<char>::~allocator(&local_f71);
            std::__cxx11::string::~string((string *)&local_f48);
            std::allocator<char>::~allocator(&local_f49);
          }
        }
      }
      else {
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        QUtil::hex_decode(&local_e60,&peVar9->provided_password);
        pMVar8 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar9 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar8->encp);
        std::__cxx11::string::operator=((string *)&peVar9->encryption_key,(string *)&local_e60);
        std::__cxx11::string::~string((string *)&local_e60);
      }
      EncryptionData::~EncryptionData((EncryptionData *)local_dd0);
      std::__cxx11::string::~string((string *)local_790);
      std::__cxx11::string::~string((string *)(Perms.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(UE.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_5d0);
      std::__cxx11::string::~string((string *)local_578);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
      std::__cxx11::string::~string
                ((string *)
                 &id_obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void
QPDF::initializeEncryption()
{
    if (m->encp->encryption_initialized) {
        return;
    }
    m->encp->encryption_initialized = true;

    // After we initialize encryption parameters, we must use stored key information and never look
    // at /Encrypt again.  Otherwise, things could go wrong if someone mutates the encryption
    // dictionary.

    if (!m->trailer.hasKey("/Encrypt")) {
        return;
    }

    // Go ahead and set m->encrypted here.  That way, isEncrypted will return true even if there
    // were errors reading the encryption dictionary.
    m->encp->encrypted = true;

    std::string id1;
    QPDFObjectHandle id_obj = m->trailer.getKey("/ID");
    if ((id_obj.isArray() && (id_obj.getArrayNItems() == 2) && id_obj.getArrayItem(0).isString())) {
        id1 = id_obj.getArrayItem(0).getStringValue();
    } else {
        // Treating a missing ID as the empty string enables qpdf to decrypt some invalid encrypted
        // files with no /ID that poppler can read but Adobe Reader can't.
        warn(damagedPDF("trailer", "invalid /ID in trailer dictionary"));
    }

    QPDFObjectHandle encryption_dict = m->trailer.getKey("/Encrypt");
    if (!encryption_dict.isDictionary()) {
        throw damagedPDF("/Encrypt in trailer dictionary is not a dictionary");
    }

    if (!(encryption_dict.getKey("/Filter").isName() &&
          (encryption_dict.getKey("/Filter").getName() == "/Standard"))) {
        throw QPDFExc(
            qpdf_e_unsupported,
            m->file->getName(),
            "encryption dictionary",
            m->file->getLastOffset(),
            "unsupported encryption filter");
    }
    if (!encryption_dict.getKey("/SubFilter").isNull()) {
        warn(
            qpdf_e_unsupported,
            "encryption dictionary",
            m->file->getLastOffset(),
            "file uses encryption SubFilters, which qpdf does not support");
    }

    if (!(encryption_dict.getKey("/V").isInteger() && encryption_dict.getKey("/R").isInteger() &&
          encryption_dict.getKey("/O").isString() && encryption_dict.getKey("/U").isString() &&
          encryption_dict.getKey("/P").isInteger())) {
        throw damagedPDF(
            "encryption dictionary",
            "some encryption dictionary parameters are missing or the wrong "
            "type");
    }

    int V = encryption_dict.getKey("/V").getIntValueAsInt();
    int R = encryption_dict.getKey("/R").getIntValueAsInt();
    std::string O = encryption_dict.getKey("/O").getStringValue();
    std::string U = encryption_dict.getKey("/U").getStringValue();
    int P = static_cast<int>(encryption_dict.getKey("/P").getIntValue());

    // If supporting new encryption R/V values, remember to update error message inside this if
    // statement.
    if (!(((R >= 2) && (R <= 6)) && ((V == 1) || (V == 2) || (V == 4) || (V == 5)))) {
        throw QPDFExc(
            qpdf_e_unsupported,
            m->file->getName(),
            "encryption dictionary",
            m->file->getLastOffset(),
            "Unsupported /R or /V in encryption dictionary; R = " + std::to_string(R) +
                " (max 6), V = " + std::to_string(V) + " (max 5)");
    }

    m->encp->encryption_V = V;
    m->encp->encryption_R = R;

    // OE, UE, and Perms are only present if V >= 5.
    std::string OE;
    std::string UE;
    std::string Perms;

    if (V < 5) {
        // These must be exactly the right number of bytes.
        pad_short_parameter(O, key_bytes);
        pad_short_parameter(U, key_bytes);
        if (!((O.length() == key_bytes) && (U.length() == key_bytes))) {
            throw damagedPDF(
                "encryption dictionary",
                "incorrect length for /O and/or /U in encryption dictionary");
        }
    } else {
        if (!(encryption_dict.getKey("/OE").isString() &&
              encryption_dict.getKey("/UE").isString() &&
              encryption_dict.getKey("/Perms").isString())) {
            throw damagedPDF(
                "encryption dictionary",
                "some V=5 encryption dictionary parameters are missing or the "
                "wrong type");
        }
        OE = encryption_dict.getKey("/OE").getStringValue();
        UE = encryption_dict.getKey("/UE").getStringValue();
        Perms = encryption_dict.getKey("/Perms").getStringValue();

        // These may be longer than the minimum number of bytes.
        pad_short_parameter(O, OU_key_bytes_V5);
        pad_short_parameter(U, OU_key_bytes_V5);
        pad_short_parameter(OE, OUE_key_bytes_V5);
        pad_short_parameter(UE, OUE_key_bytes_V5);
        pad_short_parameter(Perms, Perms_key_bytes_V5);
    }

    int Length = 0;
    if (V <= 1) {
        Length = 40;
    } else if (V == 4) {
        Length = 128;
    } else if (V == 5) {
        Length = 256;
    } else {
        if (encryption_dict.getKey("/Length").isInteger()) {
            Length = encryption_dict.getKey("/Length").getIntValueAsInt();
            if ((Length % 8) || (Length < 40) || (Length > 128)) {
                Length = 0;
            }
        }
    }
    if (Length == 0) {
        // Still no Length? Just take a guess.
        Length = 128;
    }

    m->encp->encrypt_metadata = true;
    if ((V >= 4) && (encryption_dict.getKey("/EncryptMetadata").isBool())) {
        m->encp->encrypt_metadata = encryption_dict.getKey("/EncryptMetadata").getBoolValue();
    }

    if ((V == 4) || (V == 5)) {
        QPDFObjectHandle CF = encryption_dict.getKey("/CF");
        for (auto const& filter: CF.getKeys()) {
            QPDFObjectHandle cdict = CF.getKey(filter);
            if (cdict.isDictionary()) {
                encryption_method_e method = e_none;
                if (cdict.getKey("/CFM").isName()) {
                    std::string method_name = cdict.getKey("/CFM").getName();
                    if (method_name == "/V2") {
                        QTC::TC("qpdf", "QPDF_encryption CFM V2");
                        method = e_rc4;
                    } else if (method_name == "/AESV2") {
                        QTC::TC("qpdf", "QPDF_encryption CFM AESV2");
                        method = e_aes;
                    } else if (method_name == "/AESV3") {
                        QTC::TC("qpdf", "QPDF_encryption CFM AESV3");
                        method = e_aesv3;
                    } else {
                        // Don't complain now -- maybe we won't need to reference this type.
                        method = e_unknown;
                    }
                }
                m->encp->crypt_filters[filter] = method;
            }
        }

        QPDFObjectHandle StmF = encryption_dict.getKey("/StmF");
        QPDFObjectHandle StrF = encryption_dict.getKey("/StrF");
        QPDFObjectHandle EFF = encryption_dict.getKey("/EFF");
        m->encp->cf_stream = interpretCF(m->encp, StmF);
        m->encp->cf_string = interpretCF(m->encp, StrF);
        if (EFF.isName()) {
            // qpdf does not use this for anything other than informational purposes. This is
            // intended to instruct conforming writers on which crypt filter should be used when new
            // file attachments are added to a PDF file, but qpdf never generates encrypted files
            // with non-default crypt filters. Prior to 10.2, I was under the mistaken impression
            // that this was supposed to be used for decrypting attachments, but the code was wrong
            // in a way that turns out not to have mattered because no writers were generating files
            // the way I was imagining. Still, providing this information could be useful when
            // looking at a file generated by something else, such as Acrobat when specifying that
            // only attachments should be encrypted.
            m->encp->cf_file = interpretCF(m->encp, EFF);
        } else {
            m->encp->cf_file = m->encp->cf_stream;
        }
    }

    EncryptionData data(V, R, Length / 8, P, O, U, OE, UE, Perms, id1, m->encp->encrypt_metadata);
    if (m->provided_password_is_hex_key) {
        // ignore passwords in file
    } else {
        m->encp->owner_password_matched =
            check_owner_password(m->encp->user_password, m->encp->provided_password, data);
        if (m->encp->owner_password_matched && (V < 5)) {
            // password supplied was owner password; user_password has been initialized for V < 5
            if (getTrimmedUserPassword() == m->encp->provided_password) {
                m->encp->user_password_matched = true;
                QTC::TC("qpdf", "QPDF_encryption user matches owner V < 5");
            }
        } else {
            m->encp->user_password_matched = check_user_password(m->encp->provided_password, data);
            if (m->encp->user_password_matched) {
                m->encp->user_password = m->encp->provided_password;
            }
        }
        if (m->encp->user_password_matched && m->encp->owner_password_matched) {
            QTC::TC("qpdf", "QPDF_encryption same password", (V < 5) ? 0 : 1);
        }
        if (!(m->encp->owner_password_matched || m->encp->user_password_matched)) {
            throw QPDFExc(qpdf_e_password, m->file->getName(), "", 0, "invalid password");
        }
    }

    if (m->provided_password_is_hex_key) {
        m->encp->encryption_key = QUtil::hex_decode(m->encp->provided_password);
    } else if (V < 5) {
        // For V < 5, the user password is encrypted with the owner password, and the user password
        // is always used for computing the encryption key.
        m->encp->encryption_key = compute_encryption_key(m->encp->user_password, data);
    } else {
        // For V >= 5, either password can be used independently to compute the encryption key, and
        // neither password can be used to recover the other.
        bool perms_valid;
        m->encp->encryption_key =
            recover_encryption_key_with_password(m->encp->provided_password, data, perms_valid);
        if (!perms_valid) {
            warn(damagedPDF(
                "encryption dictionary",
                "/Perms field in encryption dictionary doesn't match expected "
                "value"));
        }
    }
}